

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O0

boolean compress_output(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  jpeg_component_info *pjVar1;
  int iVar2;
  boolean bVar3;
  JBLOCKARRAY ppaJVar4;
  j_compress_ptr in_RDI;
  jpeg_component_info *compptr;
  JBLOCKROW buffer_ptr;
  JBLOCKARRAY buffer [4];
  JDIMENSION start_col;
  int yoffset;
  int yindex;
  int xindex;
  int ci;
  int blkn;
  JDIMENSION MCU_col_num;
  my_coef_ptr_conflict1 coef;
  _func_void_j_compress_ptr_J_BUF_MODE *local_70;
  long alStack_68 [5];
  uint local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  uint local_24;
  jpeg_c_coef_controller *local_20;
  j_compress_ptr local_10;
  
  local_20 = in_RDI->coef;
  local_10 = in_RDI;
  for (local_2c = 0; local_2c < local_10->comps_in_scan; local_2c = local_2c + 1) {
    pjVar1 = local_10->cur_comp_info[local_2c];
    ppaJVar4 = (*local_10->mem->access_virt_barray)
                         ((j_common_ptr)local_10,
                          (jvirt_barray_ptr)(&local_20[7].start_pass)[pjVar1->component_index],
                          *(int *)&local_20[1].start_pass * pjVar1->v_samp_factor,
                          pjVar1->v_samp_factor,0);
    alStack_68[local_2c] = (long)ppaJVar4;
  }
  local_38 = *(int *)&local_20[1].compress_data;
  do {
    if (*(int *)((long)&local_20[1].compress_data + 4) <= local_38) {
      *(int *)&local_20[1].start_pass = *(int *)&local_20[1].start_pass + 1;
      start_iMCU_row(local_10);
      return 1;
    }
    for (local_24 = *(uint *)((long)&local_20[1].start_pass + 4); local_24 < local_10->MCUs_per_row;
        local_24 = local_24 + 1) {
      local_28 = 0;
      for (local_2c = 0; local_2c < local_10->comps_in_scan; local_2c = local_2c + 1) {
        pjVar1 = local_10->cur_comp_info[local_2c];
        local_3c = local_24 * pjVar1->MCU_width;
        for (local_34 = 0; local_34 < pjVar1->MCU_height; local_34 = local_34 + 1) {
          local_70 = (_func_void_j_compress_ptr_J_BUF_MODE *)
                     (*(long *)(alStack_68[local_2c] + (long)(local_34 + local_38) * 8) +
                     (ulong)local_3c * 0x80);
          for (local_30 = 0; iVar2 = local_28, local_30 < pjVar1->MCU_width; local_30 = local_30 + 1
              ) {
            local_28 = local_28 + 1;
            (&local_20[2].start_pass)[iVar2] = local_70;
            local_70 = local_70 + 0x80;
          }
        }
      }
      bVar3 = (*local_10->entropy->encode_mcu)(local_10,(JBLOCKROW *)(local_20 + 2));
      if (bVar3 == 0) {
        *(int *)&local_20[1].compress_data = local_38;
        *(uint *)((long)&local_20[1].start_pass + 4) = local_24;
        return 0;
      }
    }
    *(undefined4 *)((long)&local_20[1].start_pass + 4) = 0;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
compress_output(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan.
   * NB: during first pass, this is safe only because the buffers will
   * already be aligned properly, so jmemmgr.c won't need to do any I/O.
   */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[compptr->component_index],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, FALSE);
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num < cinfo->MCUs_per_row;
         MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;                 /* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        start_col = MCU_col_num * compptr->MCU_width;
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          buffer_ptr = buffer[ci][yindex + yoffset] + start_col;
          for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
            coef->MCU_buffer[blkn++] = buffer_ptr++;
          }
        }
      }
      /* Try to write the MCU. */
      if (!(*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->mcu_ctr = MCU_col_num;
        return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}